

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O0

void __thiscall
QItemDelegate::doLayout
          (QItemDelegate *this,QStyleOptionViewItem *option,QRect *checkRect,QRect *pixmapRect,
          QRect *textRect,bool hint)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int ay;
  LayoutDirection direction;
  int iVar5;
  QItemDelegatePrivate *this_00;
  QWidget *pQVar6;
  int *piVar7;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  QStyleOptionViewItem *in_RSI;
  undefined8 *in_R8;
  byte in_R9B;
  long in_FS_OFFSET;
  QRect QVar8;
  int cw;
  int h;
  int w;
  int y;
  int x;
  int checkMargin;
  int pixmapMargin;
  int textMargin;
  int frameHMargin;
  bool hasMargin;
  bool hasText;
  bool hasPixmap;
  bool hasCheck;
  QStyle *style;
  QWidget *widget;
  QItemDelegatePrivate *d;
  QRect decoration;
  QRect display;
  QRect check;
  QSize pm;
  int in_stack_fffffffffffffd88;
  AlignmentFlag in_stack_fffffffffffffd8c;
  int in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  LayoutDirection LVar9;
  int in_stack_fffffffffffffd98;
  LayoutDirection LVar10;
  int in_stack_fffffffffffffd9c;
  LayoutDirection LVar11;
  int in_stack_fffffffffffffda0;
  LayoutDirection in_stack_fffffffffffffda4;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  int in_stack_fffffffffffffdc0;
  LayoutDirection in_stack_fffffffffffffdc4;
  int in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  LayoutDirection in_stack_fffffffffffffdd0;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_fffffffffffffdfc;
  int local_178;
  int local_174;
  int local_16c;
  QStyle *local_168;
  int local_158;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b4;
  undefined8 local_ac;
  undefined8 local_98;
  undefined8 local_90;
  char local_88 [32];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_3c;
  undefined1 *local_34;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  QSize local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_R9B & 1;
  this_00 = d_func((QItemDelegate *)0x8521ed);
  pQVar6 = QItemDelegatePrivate::widget(this_00,in_RSI);
  if (pQVar6 == (QWidget *)0x0) {
    local_168 = QApplication::style();
  }
  else {
    local_168 = QWidget::style((QWidget *)
                               CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  }
  bVar2 = QRect::isValid((QRect *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  bVar3 = QRect::isValid((QRect *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  bVar4 = QRect::isValid((QRect *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  if ((bVar4 || bVar3) || bVar2) {
    local_16c = (**(code **)(*(long *)local_168 + 0xe0))(local_168,0x41,0,pQVar6);
    local_16c = local_16c + 1;
  }
  else {
    local_16c = 0;
  }
  if (bVar3) {
    local_174 = local_16c;
  }
  else {
    local_174 = 0;
  }
  if (bVar2) {
    local_178 = local_16c;
  }
  else {
    local_178 = 0;
  }
  ay = QRect::left((QRect *)0x8523c5);
  direction = QRect::top((QRect *)0x8523dd);
  QRect::adjust((QRect *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                in_stack_fffffffffffffd90);
  iVar5 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  if ((iVar5 == 0) && ((!bVar3 || (bVar1 == 0)))) {
    QFontMetrics::height();
    QRect::setHeight((QRect *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                     in_stack_fffffffffffffd8c);
  }
  local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88);
  if (bVar3) {
    local_18 = QRect::size((QRect *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    local_10 = local_18;
    piVar7 = QSize::rwidth((QSize *)0x8524df);
    *piVar7 = local_174 * 2 + *piVar7;
  }
  if (bVar1 == 0) {
    local_158 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88))
    ;
    QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  }
  else {
    local_1c = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88))
    ;
    local_20 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88))
    ;
    local_24 = QSize::height((QSize *)0x85252d);
    piVar7 = qMax<int>(&local_20,&local_24);
    qMax<int>(&local_1c,piVar7);
    if ((in_RSI->decorationPosition == Left) || (in_RSI->decorationPosition == Right)) {
      local_158 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88
                                                ));
      iVar5 = QSize::width((QSize *)0x85259f);
      local_158 = local_158 + iVar5;
    }
    else {
      local_28 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88)
                             );
      local_2c = QSize::width((QSize *)0x8525d4);
      piVar7 = qMax<int>(&local_28,&local_2c);
      local_158 = *piVar7;
    }
  }
  local_3c = &DAT_aaaaaaaaaaaaaaaa;
  local_34 = &DAT_aaaaaaaaaaaaaaaa;
  QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  if (bVar2) {
    iVar5 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    if (bVar1 != 0) {
      local_158 = iVar5 + local_178 * 2 + local_158;
    }
    if ((in_RSI->super_QStyleOption).direction == RightToLeft) {
      QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                     in_stack_fffffffffffffd98);
    }
    else {
      QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                     in_stack_fffffffffffffd98);
    }
  }
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  switch(in_RSI->decorationPosition) {
  case Left:
    if ((in_RSI->super_QStyleOption).direction == LeftToRight) {
      QSize::width((QSize *)0x852c8f);
      QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                     in_stack_fffffffffffffd98);
      QRect::right((QRect *)0x852cbb);
      QSize::width((QSize *)0x852ce5);
      QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                     in_stack_fffffffffffffd98);
      local_158 = in_stack_fffffffffffffdc8;
      ay = in_stack_fffffffffffffdcc;
      direction = in_stack_fffffffffffffdd0;
    }
    else {
      QSize::width((QSize *)0x852d42);
      QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                     in_stack_fffffffffffffd98);
      QRect::right((QRect *)0x852d79);
      QSize::width((QSize *)0x852d98);
      QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                     in_stack_fffffffffffffd98);
    }
    break;
  case Right:
    if ((in_RSI->super_QStyleOption).direction == LeftToRight) {
      QSize::width((QSize *)0x852e03);
      QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                     in_stack_fffffffffffffd98);
      in_stack_fffffffffffffdc0 = QRect::right((QRect *)0x852e3a);
      in_stack_fffffffffffffdc0 = in_stack_fffffffffffffdc0 + 1;
      QSize::width((QSize *)0x852e59);
      QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                     in_stack_fffffffffffffd98);
      in_stack_fffffffffffffdc4 = direction;
      local_158 = in_stack_fffffffffffffdc8;
      ay = in_stack_fffffffffffffdcc;
      direction = in_stack_fffffffffffffdd0;
    }
    else {
      QSize::width((QSize *)0x852ea0);
      QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     direction,ay,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98);
      iVar5 = QRect::right((QRect *)0x852ecc);
      iVar5 = iVar5 + 1;
      QSize::width((QSize *)0x852ef6);
      QRect::setRect((QRect *)CONCAT44(iVar5,local_158),direction,ay,in_stack_fffffffffffffd9c,
                     in_stack_fffffffffffffd98);
      in_stack_fffffffffffffda0 = ay;
      in_stack_fffffffffffffda4 = direction;
      local_158 = in_stack_fffffffffffffdc8;
      ay = in_stack_fffffffffffffdcc;
      direction = in_stack_fffffffffffffdd0;
    }
    break;
  case Top:
    if (bVar3) {
      QSize::height((QSize *)0x8527a6);
      QSize::setHeight((QSize *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                       in_stack_fffffffffffffd8c);
    }
    if (bVar1 == 0) {
      QSize::height((QSize *)0x8527f7);
    }
    else {
      QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    }
    if ((in_RSI->super_QStyleOption).direction == RightToLeft) {
      QSize::height((QSize *)0x852867);
      QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                     in_stack_fffffffffffffd98);
      QSize::height((QSize *)0x8528b5);
      QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                     in_stack_fffffffffffffd98);
      local_158 = in_stack_fffffffffffffdc8;
      ay = in_stack_fffffffffffffdcc;
      direction = in_stack_fffffffffffffdd0;
    }
    else {
      QSize::height((QSize *)0x852932);
      QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                     in_stack_fffffffffffffd98);
      QSize::height((QSize *)0x852987);
      QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                     in_stack_fffffffffffffd98);
      local_158 = in_stack_fffffffffffffdc8;
      ay = in_stack_fffffffffffffdcc;
      direction = in_stack_fffffffffffffdd0;
    }
    break;
  case Bottom:
    if (bVar4) {
      QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      QRect::setHeight((QRect *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                       in_stack_fffffffffffffd8c);
    }
    if (bVar1 != 0) {
      QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      QSize::height((QSize *)0x852a27);
    }
    if ((in_RSI->super_QStyleOption).direction == RightToLeft) {
      QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                     in_stack_fffffffffffffd98);
      QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                     in_stack_fffffffffffffd98);
      local_158 = in_stack_fffffffffffffdc8;
      ay = in_stack_fffffffffffffdcc;
      direction = in_stack_fffffffffffffdd0;
    }
    else {
      QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                     in_stack_fffffffffffffd98);
      QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      in_stack_fffffffffffffdfc.i = direction;
      QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     in_stack_fffffffffffffda4,in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                     in_stack_fffffffffffffd98);
      local_158 = in_stack_fffffffffffffdc8;
      ay = in_stack_fffffffffffffdcc;
      direction = in_stack_fffffffffffffdd0;
    }
    break;
  default:
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               in_stack_fffffffffffffd94,
               (char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    QMessageLogger::warning(local_88,"doLayout: decoration position is invalid");
    local_68 = (undefined1 *)*in_RCX;
    puStack_60 = (undefined1 *)in_RCX[1];
    local_158 = in_stack_fffffffffffffdc8;
    ay = in_stack_fffffffffffffdcc;
    direction = in_stack_fffffffffffffdd0;
  }
  if (bVar1 == 0) {
    LVar10 = (in_RSI->super_QStyleOption).direction;
    QFlags<Qt::AlignmentFlag>::QFlags
              ((QFlags<Qt::AlignmentFlag> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               in_stack_fffffffffffffd8c);
    QRect::size((QRect *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    QVar8 = QStyle::alignedRect(direction,(Alignment)in_stack_fffffffffffffdfc.i,
                                (QSize *)CONCAT44(ay,local_158),
                                (QRect *)CONCAT44(in_stack_fffffffffffffdc4,
                                                  in_stack_fffffffffffffdc0));
    local_98 = QVar8._0_8_;
    *in_RDX = local_98;
    local_90 = QVar8._8_8_;
    in_RDX[1] = local_90;
    LVar11 = (in_RSI->super_QStyleOption).direction;
    QRect::size((QRect *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    QVar8 = QStyle::alignedRect(direction,(Alignment)in_stack_fffffffffffffdfc.i,
                                (QSize *)CONCAT44(ay,local_158),
                                (QRect *)CONCAT44(in_stack_fffffffffffffdc4,
                                                  in_stack_fffffffffffffdc0));
    local_b4 = QVar8._0_8_;
    *in_RCX = local_b4;
    local_ac = QVar8._8_8_;
    in_RCX[1] = local_ac;
    if ((in_RSI->showDecorationSelected & 1U) == 0) {
      LVar9 = (in_RSI->super_QStyleOption).direction;
      QRect::size((QRect *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      QRect::size((QRect *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      QSize::boundedTo((QSize *)CONCAT44(LVar11,LVar10),
                       (QSize *)CONCAT44(LVar9,in_stack_fffffffffffffd90));
      QVar8 = QStyle::alignedRect(direction,(Alignment)in_stack_fffffffffffffdfc.i,
                                  (QSize *)CONCAT44(ay,local_158),
                                  (QRect *)CONCAT44(in_stack_fffffffffffffdc4,
                                                    in_stack_fffffffffffffdc0));
      local_d0 = QVar8._0_8_;
      *in_R8 = local_d0;
      local_c8 = QVar8._8_8_;
      in_R8[1] = local_c8;
    }
    else {
      *in_R8 = local_58;
      in_R8[1] = puStack_50;
    }
  }
  else {
    *in_RDX = local_3c;
    in_RDX[1] = local_34;
    *in_RCX = local_68;
    in_RCX[1] = puStack_60;
    *in_R8 = local_58;
    in_R8[1] = puStack_50;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemDelegate::doLayout(const QStyleOptionViewItem &option,
                             QRect *checkRect, QRect *pixmapRect, QRect *textRect,
                             bool hint) const
{
    Q_ASSERT(checkRect && pixmapRect && textRect);
    Q_D(const QItemDelegate);
    const QWidget *widget = d->widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();
    const bool hasCheck = checkRect->isValid();
    const bool hasPixmap = pixmapRect->isValid();
    const bool hasText = textRect->isValid();
    const bool hasMargin = (hasText | hasPixmap | hasCheck);
    const int frameHMargin = hasMargin ?
                style->pixelMetric(QStyle::PM_FocusFrameHMargin, nullptr, widget) + 1 : 0;
    const int textMargin = hasText ? frameHMargin : 0;
    const int pixmapMargin = hasPixmap ? frameHMargin : 0;
    const int checkMargin = hasCheck ? frameHMargin : 0;
    const int x = option.rect.left();
    const int y = option.rect.top();
    int w, h;

    textRect->adjust(-textMargin, 0, textMargin, 0); // add width padding
    if (textRect->height() == 0 && (!hasPixmap || !hint)) {
        //if there is no text, we still want to have a decent height for the item sizeHint and the editor size
        textRect->setHeight(option.fontMetrics.height());
    }

    QSize pm(0, 0);
    if (hasPixmap) {
        pm = pixmapRect->size();
        pm.rwidth() += 2 * pixmapMargin;
    }
    if (hint) {
        h = qMax(checkRect->height(), qMax(textRect->height(), pm.height()));
        if (option.decorationPosition == QStyleOptionViewItem::Left
            || option.decorationPosition == QStyleOptionViewItem::Right) {
            w = textRect->width() + pm.width();
        } else {
            w = qMax(textRect->width(), pm.width());
        }
    } else {
        w = option.rect.width();
        h = option.rect.height();
    }

    int cw = 0;
    QRect check;
    if (hasCheck) {
        cw = checkRect->width() + 2 * checkMargin;
        if (hint) w += cw;
        if (option.direction == Qt::RightToLeft) {
            check.setRect(x + w - cw, y, cw, h);
        } else {
            check.setRect(x, y, cw, h);
        }
    }

    // at this point w should be the *total* width

    QRect display;
    QRect decoration;
    switch (option.decorationPosition) {
    case QStyleOptionViewItem::Top: {
        if (hasPixmap)
            pm.setHeight(pm.height() + pixmapMargin); // add space
        h = hint ? textRect->height() : h - pm.height();

        if (option.direction == Qt::RightToLeft) {
            decoration.setRect(x, y, w - cw, pm.height());
            display.setRect(x, y + pm.height(), w - cw, h);
        } else {
            decoration.setRect(x + cw, y, w - cw, pm.height());
            display.setRect(x + cw, y + pm.height(), w - cw, h);
        }
        break; }
    case QStyleOptionViewItem::Bottom: {
        if (hasText)
            textRect->setHeight(textRect->height() + textMargin); // add space
        h = hint ? textRect->height() + pm.height() : h;

        if (option.direction == Qt::RightToLeft) {
            display.setRect(x, y, w - cw, textRect->height());
            decoration.setRect(x, y + textRect->height(), w - cw, h - textRect->height());
        } else {
            display.setRect(x + cw, y, w - cw, textRect->height());
            decoration.setRect(x + cw, y + textRect->height(), w - cw, h - textRect->height());
        }
        break; }
    case QStyleOptionViewItem::Left: {
        if (option.direction == Qt::LeftToRight) {
            decoration.setRect(x + cw, y, pm.width(), h);
            display.setRect(decoration.right() + 1, y, w - pm.width() - cw, h);
        } else {
            display.setRect(x, y, w - pm.width() - cw, h);
            decoration.setRect(display.right() + 1, y, pm.width(), h);
        }
        break; }
    case QStyleOptionViewItem::Right: {
        if (option.direction == Qt::LeftToRight) {
            display.setRect(x + cw, y, w - pm.width() - cw, h);
            decoration.setRect(display.right() + 1, y, pm.width(), h);
        } else {
            decoration.setRect(x, y, pm.width(), h);
            display.setRect(decoration.right() + 1, y, w - pm.width() - cw, h);
        }
        break; }
    default:
        qWarning("doLayout: decoration position is invalid");
        decoration = *pixmapRect;
        break;
    }

    if (!hint) { // we only need to do the internal layout if we are going to paint
        *checkRect = QStyle::alignedRect(option.direction, Qt::AlignCenter,
                                         checkRect->size(), check);
        *pixmapRect = QStyle::alignedRect(option.direction, option.decorationAlignment,
                                          pixmapRect->size(), decoration);
        // the text takes up all available space, unless the decoration is not shown as selected
        if (option.showDecorationSelected)
            *textRect = display;
        else
            *textRect = QStyle::alignedRect(option.direction, option.displayAlignment,
                                            textRect->size().boundedTo(display.size()), display);
    } else {
        *checkRect = check;
        *pixmapRect = decoration;
        *textRect = display;
    }
}